

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMA_OBJECT_Unmarshal(TPMA_OBJECT *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPMA_OBJECT TVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    TVar2 = (TPMA_OBJECT)ByteArrayToUint32(*buffer);
    *target = TVar2;
    *buffer = *buffer + 4;
    TVar3 = 0xa1;
    if (((uint)*target & 0xfff8f309) == 0) {
      TVar3 = 0;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMA_OBJECT_Unmarshal(TPMA_OBJECT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(*((UINT32 *)target) & (UINT32)0xfff8f309)
        return TPM_RC_RESERVED_BITS;
    return TPM_RC_SUCCESS;
}